

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# observer.hpp
# Opt level: O3

void __thiscall tf::TFProfObserver::summary(TFProfObserver *this,ostream *os)

{
  size_t *psVar1;
  pointer pSVar2;
  pointer pSVar3;
  size_t sVar4;
  iterator iVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  pointer pvVar9;
  ostream *poVar10;
  observer_stamp_t *poVar11;
  pointer pvVar12;
  ulong uVar13;
  pointer pvVar14;
  long lVar15;
  bool bVar16;
  ulong uVar17;
  size_t sVar18;
  pointer *ppvVar19;
  size_t sVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  long unaff_R12;
  long unaff_R13;
  bool bVar24;
  Summary summary;
  WorkerSummary ws;
  undefined1 local_238 [224];
  pointer local_158;
  iterator iStack_150;
  WorkerSummary *local_148;
  WorkerSummary local_140;
  
  lVar6 = 0;
  do {
    *(undefined8 *)(local_238 + lVar6) = 0;
    *(undefined8 *)(local_238 + lVar6 + 8) = 0;
    lVar6 = lVar6 + 0x20;
  } while (lVar6 != 0xe0);
  local_158 = (pointer)0x0;
  iStack_150._M_current = (WorkerSummary *)0x0;
  local_148 = (WorkerSummary *)0x0;
  pvVar9 = (this->_timeline).segments.
           super__Vector_base<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>,_std::allocator<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar12 = (this->_timeline).segments.
            super__Vector_base<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>,_std::allocator<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  uVar13 = ((long)pvVar12 - (long)pvVar9 >> 3) * -0x5555555555555555;
  if (pvVar12 == pvVar9) {
    uVar21 = 0;
  }
  else {
    uVar17 = uVar13 + (uVar13 == 0);
    ppvVar19 = &(pvVar9->
                super__Vector_base<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
    uVar22 = 0;
    do {
      uVar21 = uVar22;
      if (*ppvVar19 != ((_Vector_impl_data *)(ppvVar19 + -1))->_M_start) break;
      uVar22 = uVar22 + 1;
      ppvVar19 = ppvVar19 + 3;
      uVar21 = uVar17;
    } while (uVar17 != uVar22);
  }
  if (uVar21 < uVar13) {
    bVar24 = false;
    bVar16 = false;
    do {
      pvVar14 = pvVar9[uVar21].
                super__Vector_base<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (pvVar9[uVar21].
          super__Vector_base<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish != pvVar14) {
        pvVar12 = pvVar9 + uVar21;
        uVar13 = 0;
        do {
          if (pvVar14[uVar13].super__Vector_base<tf::Segment,_std::allocator<tf::Segment>_>._M_impl.
              super__Vector_impl_data._M_start !=
              pvVar14[uVar13].super__Vector_base<tf::Segment,_std::allocator<tf::Segment>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            local_140.min_span = 0;
            local_140.max_span = 0;
            local_140.total_span = 0;
            lVar6 = 0x30;
            do {
              *(undefined8 *)((long)local_140.tsum._M_elems + lVar6 + -0x30) = 0;
              *(undefined8 *)((long)local_140.tsum._M_elems + lVar6 + -0x28) = 0;
              lVar6 = lVar6 + 0x20;
            } while (lVar6 != 0x110);
            local_140.id = uVar21;
            local_140.level = uVar13;
            pvVar14 = (pvVar12->
                      super__Vector_base<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            pSVar2 = pvVar14[uVar13].super__Vector_base<tf::Segment,_std::allocator<tf::Segment>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            pSVar3 = *(pointer *)
                      ((long)&pvVar14[uVar13].
                              super__Vector_base<tf::Segment,_std::allocator<tf::Segment>_>._M_impl.
                              super__Vector_impl_data + 8);
            sVar18 = ((long)pSVar3 - (long)pSVar2 >> 3) * 0x6db6db6db6db6db7;
            local_140.count = sVar18;
            if (pSVar3 != pSVar2) {
              poVar11 = &pSVar2->end;
              sVar20 = 0;
              lVar6 = 0;
              do {
                lVar15 = poVar11[-1].__d.__r;
                if (lVar15 < unaff_R13) {
                  unaff_R13 = lVar15;
                }
                if (!bVar24) {
                  bVar24 = true;
                  unaff_R13 = lVar15;
                }
                lVar7 = (poVar11->__d).__r;
                if (unaff_R12 <= lVar7) {
                  unaff_R12 = lVar7;
                }
                if (!bVar16) {
                  bVar16 = true;
                  unaff_R12 = lVar7;
                }
                uVar17 = (lVar7 - lVar15) / 1000;
                lVar7 = (long)(int)*(TaskType *)(poVar11 + -2);
                lVar8 = lVar7 * 0x20;
                lVar15 = *(long *)(local_238 + lVar8);
                *(long *)(local_238 + lVar8) = lVar15 + 1;
                *(ulong *)(local_238 + lVar8 + 8) = *(long *)(local_238 + lVar8 + 8) + uVar17;
                uVar22 = uVar17;
                uVar23 = uVar17;
                if (lVar15 != 0) {
                  uVar23 = *(ulong *)(local_238 + lVar8 + 0x10);
                  if (uVar17 <= *(ulong *)(local_238 + lVar8 + 0x10)) {
                    uVar23 = uVar17;
                  }
                  uVar22 = *(ulong *)(local_238 + lVar8 + 0x18);
                  if (*(ulong *)(local_238 + lVar8 + 0x18) < uVar17) {
                    uVar22 = uVar17;
                  }
                }
                *(ulong *)(local_238 + lVar8 + 0x10) = uVar23;
                *(ulong *)(local_238 + lVar8 + 0x18) = uVar22;
                sVar20 = sVar20 + uVar17;
                local_140.total_span = sVar20;
                if (lVar6 == 0) {
                  local_140.min_span = uVar17;
                  local_140.max_span = uVar17;
                }
                else {
                  if (uVar17 <= local_140.min_span) {
                    local_140.min_span = uVar17;
                  }
                  if (local_140.max_span < uVar17) {
                    local_140.max_span = uVar17;
                  }
                }
                sVar4 = local_140.tsum._M_elems[lVar7].count;
                local_140.tsum._M_elems[lVar7].count = sVar4 + 1;
                psVar1 = &local_140.tsum._M_elems[lVar7].total_span;
                *psVar1 = *psVar1 + uVar17;
                uVar22 = uVar17;
                if (sVar4 != 0) {
                  uVar22 = local_140.tsum._M_elems[lVar7].min_span;
                  uVar23 = local_140.tsum._M_elems[lVar7].max_span;
                  if (uVar17 <= uVar22) {
                    uVar22 = uVar17;
                  }
                  if (uVar17 <= uVar23) {
                    uVar17 = uVar23;
                  }
                }
                local_140.tsum._M_elems[lVar7].min_span = uVar22;
                local_140.tsum._M_elems[lVar7].max_span = uVar17;
                lVar6 = lVar6 + 1;
                poVar11 = poVar11 + 7;
              } while (sVar18 + (sVar18 == 0) != lVar6);
            }
            iVar5._M_current = iStack_150._M_current;
            if (iStack_150._M_current == local_148) {
              std::
              vector<tf::TFProfObserver::WorkerSummary,std::allocator<tf::TFProfObserver::WorkerSummary>>
              ::_M_realloc_insert<tf::TFProfObserver::WorkerSummary_const&>
                        ((vector<tf::TFProfObserver::WorkerSummary,std::allocator<tf::TFProfObserver::WorkerSummary>>
                          *)&local_158,iStack_150,&local_140);
            }
            else {
              memcpy(iStack_150._M_current,&local_140,0x110);
              iStack_150._M_current = iVar5._M_current + 1;
            }
            pvVar9 = (this->_timeline).segments.
                     super__Vector_base<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>,_std::allocator<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          }
          uVar13 = uVar13 + 1;
          pvVar12 = pvVar9 + uVar21;
          pvVar14 = (pvVar12->
                    super__Vector_base<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
        } while (uVar13 < (ulong)(((long)(pvVar12->
                                         super__Vector_base<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar14
                                  >> 3) * -0x5555555555555555));
        pvVar12 = (this->_timeline).segments.
                  super__Vector_base<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>,_std::allocator<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      uVar21 = uVar21 + 1;
    } while (uVar21 < (ulong)(((long)pvVar12 - (long)pvVar9 >> 3) * -0x5555555555555555));
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"==Observer ",0xb);
  poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)os);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,": ",2);
  lVar6 = (long)(this->_timeline).segments.
                super__Vector_base<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>,_std::allocator<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->_timeline).segments.
                super__Vector_base<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>,_std::allocator<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  if (lVar6 != 0) {
    lVar6 = (lVar6 >> 3) * -0x5555555555555555;
    lVar6 = lVar6 + (ulong)(lVar6 == 0);
    do {
      lVar6 = lVar6 + -1;
    } while (lVar6 != 0);
  }
  poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10," workers completed ",0x13);
  pvVar9 = (this->_timeline).segments.
           super__Vector_base<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>,_std::allocator<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar6 = (long)(this->_timeline).segments.
                super__Vector_base<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>,_std::allocator<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar9;
  if (lVar6 != 0) {
    lVar6 = (lVar6 >> 3) * -0x5555555555555555;
    lVar15 = 0;
    do {
      lVar7 = (long)*(pointer *)
                     ((long)&pvVar9[lVar15].
                             super__Vector_base<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>
                             ._M_impl.super__Vector_impl_data + 8) -
              *(long *)&pvVar9[lVar15].
                        super__Vector_base<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>
                        ._M_impl.super__Vector_impl_data;
      if (lVar7 != 0) {
        lVar7 = (lVar7 >> 3) * -0x5555555555555555;
        lVar7 = lVar7 + (ulong)(lVar7 == 0);
        do {
          lVar7 = lVar7 + -1;
        } while (lVar7 != 0);
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 != lVar6 + (ulong)(lVar6 == 0));
  }
  poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10," tasks in ",10);
  poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10," us\n",4);
  Summary::dump_tsum((Summary *)local_238,os);
  local_140.id = CONCAT71(local_140.id._1_7_,10);
  std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_140,1);
  Summary::dump_wsum((Summary *)local_238,os);
  if (local_158 != (pointer)0x0) {
    operator_delete(local_158,(long)local_148 - (long)local_158);
  }
  return;
}

Assistant:

inline void TFProfObserver::summary(std::ostream& os) const {

  using namespace std::chrono;
  
  Summary summary;
  std::optional<observer_stamp_t> view_beg, view_end;

  // find the first non-empty worker
  size_t first;
  for(first = 0; first<_timeline.segments.size(); ++first) {
    if(_timeline.segments[first].size() > 0) { 
      break; 
    }
  }
  
  // not timeline data to dump
  if(first == _timeline.segments.size()) {
    goto end_of_summary;
  }

  for(size_t w=first; w<_timeline.segments.size(); w++) {
    for(size_t l=0; l<_timeline.segments[w].size(); l++) {

      if(_timeline.segments[w][l].empty()) {
        continue;
      }

      // worker w at level l
      WorkerSummary ws;
      ws.id = w;
      ws.level = l;
      ws.count = _timeline.segments[w][l].size();
      
      // scan all tasks at level l
      for(size_t i=0; i<_timeline.segments[w][l].size(); ++i) {
        
        // update the entire span
        auto& s = _timeline.segments[w][l][i];
        view_beg = view_beg ? (std::min)(*view_beg, s.beg) : s.beg;
        view_end = view_end ? (std::max)(*view_end, s.end) : s.end;
        
        // update the task summary
        size_t t = duration_cast<microseconds>(s.end - s.beg).count();

        auto& x = summary.tsum[static_cast<int>(s.type)];
        x.count += 1;
        x.total_span += t;
        x.min_span = (x.count == 1) ? t : (std::min)(t, x.min_span);
        x.max_span = (x.count == 1) ? t : (std::max)(t, x.max_span);

        // update the worker summary
        ws.total_span += t;
        ws.min_span = (i == 0) ? t : (std::min)(t, ws.min_span);
        ws.max_span = (i == 0) ? t : (std::max)(t, ws.max_span);

        auto&y = ws.tsum[static_cast<int>(s.type)];
        y.count += 1;
        y.total_span += t;
        y.min_span = (y.count == 1) ? t : (std::min)(t, y.min_span);
        y.max_span = (y.count == 1) ? t : (std::max)(t, y.max_span);
        
        // update the delay
        //if(i) {
        //  size_t d = duration_cast<nanoseconds>(
        //    s.beg - _timeline.segments[w][l][i-1].end
        //  ).count();
        //  ws.total_delay += d;
        //  ws.min_delay = (i == 1) ? d : std::min(ws.min_delay, d);
        //  ws.max_delay = (i == 1) ? d : std::max(ws.max_delay, d);
        //}
      }
      summary.wsum.push_back(ws);
    }
  }

  end_of_summary:

  size_t view = 0;
  if(view_beg && view_end) {
    view = duration_cast<microseconds>(*view_end - *view_beg).count();
  }

  os << "==Observer " << _timeline.uid << ": "
     << num_workers() << " workers completed "
     << num_tasks() << " tasks in "
     << view << " us\n";

  summary.dump(os);
}